

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O0

void __thiscall
ON_ReferencedComponentSettingsImpl::AfterLayerTableAddedToModelImpl
          (ON_ReferencedComponentSettingsImpl *this,ON_ComponentManifest *source_archive_manifest,
          ON_ComponentManifest *model_manifest,ON_ManifestMap *archive_to_model_map)

{
  uchar auVar1 [8];
  Type TVar2;
  bool bVar3;
  int iVar4;
  uchar (*pauVar5) [8];
  ON_Layer **ppOVar6;
  ON_UUID *pOVar7;
  ON_ManifestMapItem *__src;
  ON_UUID *id2;
  undefined1 local_68 [8];
  ON_ManifestMapItem map_item;
  ON_Layer *layer;
  int i;
  int count;
  ON_ManifestMap *archive_to_model_map_local;
  ON_ComponentManifest *model_manifest_local;
  ON_ComponentManifest *source_archive_manifest_local;
  ON_ReferencedComponentSettingsImpl *this_local;
  
  InternalDestroyLayerArray(&this->m_layer_model_copy);
  ON_UuidPairList2::Empty(&this->m_runtime_layer_id_map);
  layer._4_4_ = 0;
  layer._0_4_ = 0;
  do {
    iVar4 = ON_SimpleArray<ON_Layer_*>::Count(&this->m_layer_referenced_file_copy);
    if (iVar4 <= (int)layer) {
      ON_SimpleArray<ON_Layer_*>::SetCount(&this->m_layer_referenced_file_copy,layer._4_4_);
      ON_UuidPairList2::ImproveSearchSpeed(&this->m_runtime_layer_id_map);
      return;
    }
    pauVar5 = (uchar (*) [8])
              ON_SimpleArray<ON_Layer_*>::operator[](&this->m_layer_referenced_file_copy,(int)layer)
    ;
    map_item.m_destination_id.Data4 = *pauVar5;
    if (map_item.m_destination_id.Data4 != (uchar  [8])0x0) {
      ppOVar6 = ON_SimpleArray<ON_Layer_*>::operator[]
                          (&this->m_layer_referenced_file_copy,(int)layer);
      *ppOVar6 = (ON_Layer *)0x0;
      pOVar7 = ON_ModelComponent::Id((ON_ModelComponent *)map_item.m_destination_id.Data4);
      __src = ON_ManifestMap::MapItemFromSourceId(archive_to_model_map,pOVar7);
      memcpy(local_68,__src,0x30);
      TVar2 = ON_ManifestMapItem::ComponentType((ON_ManifestMapItem *)local_68);
      if (TVar2 == Layer) {
        pOVar7 = ON_ManifestMapItem::DestinationId((ON_ManifestMapItem *)local_68);
        bVar3 = ::operator==(&ON_nil_uuid,pOVar7);
        if (!bVar3) {
          pOVar7 = ON_ManifestMapItem::SourceId((ON_ManifestMapItem *)local_68);
          id2 = ON_ManifestMapItem::DestinationId((ON_ManifestMapItem *)local_68);
          bVar3 = ON_UuidPairList2::AddPair(&this->m_runtime_layer_id_map,pOVar7,id2);
          if (bVar3) {
            ON_Layer::DeletePerViewportSettings
                      ((ON_Layer *)map_item.m_destination_id.Data4,&ON_nil_uuid);
            auVar1 = map_item.m_destination_id.Data4;
            pauVar5 = (uchar (*) [8])
                      ON_SimpleArray<ON_Layer_*>::operator[]
                                (&this->m_layer_referenced_file_copy,layer._4_4_);
            *pauVar5 = auVar1;
            layer._4_4_ = layer._4_4_ + 1;
          }
          else if (map_item.m_destination_id.Data4 != (uchar  [8])0x0) {
            (**(code **)(*(long *)map_item.m_destination_id.Data4 + 0x20))();
          }
          goto LAB_0065eb42;
        }
      }
      if (map_item.m_destination_id.Data4 != (uchar  [8])0x0) {
        (**(code **)(*(long *)map_item.m_destination_id.Data4 + 0x20))();
      }
    }
LAB_0065eb42:
    layer._0_4_ = (int)layer + 1;
  } while( true );
}

Assistant:

void ON_ReferencedComponentSettingsImpl::AfterLayerTableAddedToModelImpl(
  const class ON_ComponentManifest& source_archive_manifest,
  const class ON_ComponentManifest& model_manifest,
  const class ON_ManifestMap& archive_to_model_map
)
{
  InternalDestroyLayerArray(m_layer_model_copy);
  m_runtime_layer_id_map.Empty();
  int count = 0;
  for (int i = 0; i < m_layer_referenced_file_copy.Count(); i++)
  {
    ON_Layer* layer = m_layer_referenced_file_copy[i];
    if (nullptr == layer)
      continue;
    m_layer_referenced_file_copy[i] = nullptr;
    ON_ManifestMapItem map_item = archive_to_model_map.MapItemFromSourceId(layer->Id());
    if (ON_ModelComponent::Type::Layer != map_item.ComponentType() || ON_nil_uuid == map_item.DestinationId())
    {
      delete layer;
      continue;
    }
    if (false == m_runtime_layer_id_map.AddPair(map_item.SourceId(),map_item.DestinationId()))
    {
      delete layer;
      continue;
    }
    // If this layer came from reading a non-.3dm file,
    // it might have per viewport settings that apply to 
    // the viewports in the reference file.
    // These viewports are not in the current model and
    // any reference file per viewport settings should be deleted.
    layer->DeletePerViewportSettings(ON_nil_uuid);

    m_layer_referenced_file_copy[count++] = layer;
  }
  m_layer_referenced_file_copy.SetCount(count);
  m_runtime_layer_id_map.ImproveSearchSpeed();
}